

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::EntryDefineGetter(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  PropertyId propId;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptLibrary *pJVar7;
  RecyclableObject *pRVar8;
  RecyclableObject *local_b8;
  RecyclableObject *local_b0;
  undefined1 local_98 [8];
  PropertyDescriptor propertyDescriptor;
  PropertyRecord *propertyRecord;
  Var propertyKey;
  Var getterFunc;
  RecyclableObject *obj;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x57f,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  obj = (RecyclableObject *)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x582,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pvVar6);
  getterFunc = (Var)0x0;
  pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
  BVar3 = JavascriptConversion::ToObject
                    (pvVar6,(ScriptContext *)obj,(RecyclableObject **)&getterFunc);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)obj,-0x7ff5ec42,L"Object.prototype.__defineGetter__");
  }
  if (((uint)scriptContext & 0xffffff) < 3) {
    pJVar7 = RecyclableObject::GetLibrary((RecyclableObject *)getterFunc);
    local_b0 = JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
  }
  else {
    local_b0 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,2);
  }
  bVar2 = JavascriptConversion::IsCallable(local_b0);
  if (!bVar2) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)obj,-0x7ff5ec34,L"Object.prototype.__defineGetter__");
  }
  if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
    pJVar7 = RecyclableObject::GetLibrary((RecyclableObject *)getterFunc);
    local_b8 = JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
  }
  else {
    local_b8 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
  }
  JavascriptConversion::ToPropertyKey
            (local_b8,(ScriptContext *)obj,(PropertyRecord **)&propertyDescriptor.Configurable,
             (PropertyString **)0x0);
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_98);
  PropertyDescriptor::SetEnumerable((PropertyDescriptor *)local_98,true);
  PropertyDescriptor::SetConfigurable((PropertyDescriptor *)local_98,true);
  PropertyDescriptor::SetGetter((PropertyDescriptor *)local_98,local_b0);
  pvVar6 = getterFunc;
  propId = PropertyRecord::GetPropertyId((PropertyRecord *)propertyDescriptor._40_8_);
  DefineOwnPropertyHelper
            ((RecyclableObject *)pvVar6,propId,(PropertyDescriptor *)local_98,(ScriptContext *)obj,
             true);
  pJVar7 = RecyclableObject::GetLibrary((RecyclableObject *)getterFunc);
  pRVar8 = JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
  return pRVar8;
}

Assistant:

Var JavascriptObject::EntryDefineGetter(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    // For browser interop, simulate LdThis by calling OP implementation directly.
    // Do not have module id here so use the global id, 0.
    //
#if ENABLE_COPYONACCESS_ARRAY
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(args[0]);
#endif
    RecyclableObject* obj = nullptr;
    if (!JavascriptConversion::ToObject(args[0], scriptContext, &obj))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Object.prototype.__defineGetter__"));
    }

    Var getterFunc = args.Info.Count > 2 ? args[2] : obj->GetLibrary()->GetUndefined();

    if (!JavascriptConversion::IsCallable(getterFunc))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Object.prototype.__defineGetter__"));
    }

    Var propertyKey = args.Info.Count > 1 ? args[1] : obj->GetLibrary()->GetUndefined();
    const PropertyRecord* propertyRecord;
    JavascriptConversion::ToPropertyKey(propertyKey, scriptContext, &propertyRecord, nullptr);

    PropertyDescriptor propertyDescriptor;
    propertyDescriptor.SetEnumerable(true);
    propertyDescriptor.SetConfigurable(true);
    propertyDescriptor.SetGetter(getterFunc);

    DefineOwnPropertyHelper(obj, propertyRecord->GetPropertyId(), propertyDescriptor, scriptContext);

    return obj->GetLibrary()->GetUndefined();
}